

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# general_cast.hpp
# Opt level: O0

int duckdb::HandleVectorCastError::Operation<int>
              (string *error_message,ValidityMask *mask,idx_t idx,VectorTryCastData *cast_data)

{
  int iVar1;
  string *in_RCX;
  CastParameters *in_stack_ffffffffffffffd8;
  
  HandleCastError::AssignError(in_RCX,in_stack_ffffffffffffffd8);
  (in_RCX->field_2)._M_local_buf[0] = '\0';
  TemplatedValidityMask<unsigned_long>::SetInvalid
            ((TemplatedValidityMask<unsigned_long> *)in_RCX,(idx_t)in_stack_ffffffffffffffd8);
  iVar1 = NullValue<int>();
  return iVar1;
}

Assistant:

static RESULT_TYPE Operation(const string &error_message, ValidityMask &mask, idx_t idx,
	                             VectorTryCastData &cast_data) {
		HandleCastError::AssignError(error_message, cast_data.parameters);
		cast_data.all_converted = false;
		mask.SetInvalid(idx);
		return NullValue<RESULT_TYPE>();
	}